

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
Shell::assertModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertModule *assn)

{
  __shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var1;
  element_type *peVar2;
  allocator<char> local_1d1;
  Err local_1d0;
  allocator<char> local_1a9;
  Err local_1a8;
  Err local_188;
  Ok local_161;
  string *local_160;
  Err *err_2;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instance;
  Err local_128;
  Err local_108;
  Ok local_e1;
  string *local_e0;
  Err *err_1;
  Result<wasm::Ok> valid;
  Err local_a8;
  Err local_88;
  undefined4 local_68;
  Ok local_51;
  string *local_50;
  Err *err;
  Result<std::shared_ptr<wasm::Module>_> wasm;
  AssertModule *assn_local;
  Shell *this_local;
  
  wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ = assn;
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)&err,this,&assn->wasm);
  local_50 = (string *)
             ::wasm::Result<std::shared_ptr<wasm::Module>_>::getErr
                       ((Result<std::shared_ptr<wasm::Module>_> *)&err);
  if (local_50 == (string *)0x0) {
    if (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ == 1)
    {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"expected malformed module",
                 (allocator<char> *)
                 ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
      ::wasm::Err::~Err(&local_a8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      local_68 = 1;
    }
    else {
      p_Var1 = (__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               ::wasm::Result<std::shared_ptr<wasm::Module>_>::operator*
                         ((Result<std::shared_ptr<wasm::Module>_> *)&err);
      peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(p_Var1);
      validateModule((Result<wasm::Ok> *)&err_1,this,peVar2);
      local_e0 = (string *)::wasm::Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
      if (local_e0 == (string *)0x0) {
        if (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ ==
            2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,"expected invalid module",
                     (allocator<char> *)
                     ((long)&instance.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x27));
          ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_128);
          ::wasm::Err::~Err(&local_128);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&instance.val.
                             super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             .
                             super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                     + 0x27));
          local_68 = 1;
        }
        else {
          p_Var1 = (__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   ::wasm::Result<std::shared_ptr<wasm::Module>_>::operator*
                             ((Result<std::shared_ptr<wasm::Module>_> *)&err);
          peVar2 = std::__shared_ptr_access<wasm::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(p_Var1);
          instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                       *)&err_2,this,peVar2);
          local_160 = (string *)
                      ::wasm::
                      Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                      ::getErr((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                                *)&err_2);
          if (local_160 == (string *)0x0) {
            if (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        _32_8_ == 3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1a8,"expected unlinkable module",&local_1a9);
              ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1a8);
              ::wasm::Err::~Err(&local_1a8);
              std::allocator<char>::~allocator(&local_1a9);
            }
            else {
              if (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                          _32_8_ != 0) {
                ::wasm::handle_unreachable
                          ("unexpected module assertion",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                           ,0x1b8);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1d0,"expected instantiation to trap",&local_1d1);
              ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_1d0);
              ::wasm::Err::~Err(&local_1d0);
              std::allocator<char>::~allocator(&local_1d1);
            }
          }
          else if ((*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                            _32_8_ == 3) ||
                  (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           _32_8_ == 0)) {
            ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_161);
          }
          else {
            std::__cxx11::string::string((string *)&local_188,local_160);
            ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_188);
            ::wasm::Err::~Err(&local_188);
          }
          local_68 = 1;
          ::wasm::
          Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
          ::~Result((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                     *)&err_2);
        }
      }
      else if (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                       super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_
               == 2) {
        ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_e1);
        local_68 = 1;
      }
      else {
        std::__cxx11::string::string((string *)&local_108,local_e0);
        ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_108);
        ::wasm::Err::~Err(&local_108);
        local_68 = 1;
      }
      ::wasm::Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    }
  }
  else if ((*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ ==
            1) || (*(int *)wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                           _32_8_ == 2)) {
    ::wasm::Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_51);
    local_68 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_88,local_50);
    ::wasm::Result<wasm::Ok>::Result(__return_storage_ptr__,&local_88);
    ::wasm::Err::~Err(&local_88);
    local_68 = 1;
  }
  ::wasm::Result<std::shared_ptr<wasm::Module>_>::~Result
            ((Result<std::shared_ptr<wasm::Module>_> *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result<> assertModule(AssertModule& assn) {
    auto wasm = makeModule(assn.wasm);
    if (const auto* err = wasm.getErr()) {
      if (assn.type == ModuleAssertionType::Malformed ||
          assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Malformed) {
      return Err{"expected malformed module"};
    }

    auto valid = validateModule(**wasm);
    if (auto* err = valid.getErr()) {
      if (assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Invalid) {
      return Err{"expected invalid module"};
    }

    auto instance = instantiate(**wasm);
    if (auto* err = instance.getErr()) {
      if (assn.type == ModuleAssertionType::Unlinkable ||
          assn.type == ModuleAssertionType::Trap) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Unlinkable) {
      return Err{"expected unlinkable module"};
    }
    if (assn.type == ModuleAssertionType::Trap) {
      return Err{"expected instantiation to trap"};
    }

    WASM_UNREACHABLE("unexpected module assertion");
  }